

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O0

void OPL_CALC_RH(OPL_CH *CH,uint noise)

{
  uint uVar1;
  int iVar2;
  int local_40;
  uchar res2_1;
  uchar bit3e_1;
  uchar bit5e_1;
  UINT32 phase_2;
  uchar res1_1;
  uchar bit2_1;
  uchar bit3_1;
  uchar bit7_1;
  UINT32 phase_1;
  uchar bit8;
  uchar res2;
  uchar bit3e;
  uchar bit5e;
  UINT32 phase;
  uchar res1;
  uchar bit2;
  uchar bit3;
  uchar bit7;
  uint env;
  int out;
  OPL_SLOT *SLOT;
  uint noise_local;
  OPL_CH *CH_local;
  
  phase_modulation = 0;
  uVar1 = CH[6].SLOT[0].TLL + CH[6].SLOT[0].volume + (LFO_AM & CH[6].SLOT[0].AMmask);
  _res1 = CH[6].SLOT[0].op1_out[0] + CH[6].SLOT[0].op1_out[1];
  CH[6].SLOT[0].op1_out[0] = CH[6].SLOT[0].op1_out[1];
  if (CH[6].SLOT[0].CON == '\0') {
    phase_modulation = CH[6].SLOT[0].op1_out[0];
  }
  CH[6].SLOT[0].op1_out[1] = 0;
  if (uVar1 < 0x180) {
    if (CH[6].SLOT[0].FB == '\0') {
      _res1 = 0;
    }
    iVar2 = op_calc1(CH[6].SLOT[0].Cnt,uVar1,_res1 << (CH[6].SLOT[0].FB & 0x1f),
                     CH[6].SLOT[0].wavetable);
    CH[6].SLOT[0].op1_out[1] = iVar2;
  }
  uVar1 = CH[6].SLOT[1].TLL + CH[6].SLOT[1].volume + (LFO_AM & CH[6].SLOT[1].AMmask);
  if (uVar1 < 0x180) {
    iVar2 = op_calc(CH[6].SLOT[1].Cnt,uVar1,phase_modulation,CH[6].SLOT[1].wavetable);
    output = iVar2 * 2 + output;
  }
  uVar1 = CH[7].SLOT[0].TLL + CH[7].SLOT[0].volume + (LFO_AM & CH[7].SLOT[0].AMmask);
  if (uVar1 < 0x180) {
    phase_1 = 0xd0;
    if (((byte)(CH[7].SLOT[0].Cnt >> 0x12) & 1) != ((byte)(CH[7].SLOT[0].Cnt >> 0x17) & 1) ||
        (CH[7].SLOT[0].Cnt >> 0x13 & 1) != 0) {
      phase_1 = 0x234;
    }
    if (((byte)(CH[8].SLOT[1].Cnt >> 0x13) & 1) != ((byte)(CH[8].SLOT[1].Cnt >> 0x15) & 1)) {
      phase_1 = 0x234;
    }
    if ((phase_1 & 0x200) == 0) {
      if (noise != 0) {
        phase_1 = 0x34;
      }
    }
    else if (noise != 0) {
      phase_1 = 0x2d0;
    }
    iVar2 = op_calc(phase_1 << 0x10,uVar1,0,CH[7].SLOT[0].wavetable);
    output = iVar2 * 2 + output;
  }
  uVar1 = CH[7].SLOT[1].TLL + CH[7].SLOT[1].volume + (LFO_AM & CH[7].SLOT[1].AMmask);
  if (uVar1 < 0x180) {
    phase_2 = 0x100;
    if ((CH[7].SLOT[0].Cnt & 0x1000000) != 0) {
      phase_2 = 0x200;
    }
    if (noise != 0) {
      phase_2 = phase_2 ^ 0x100;
    }
    iVar2 = op_calc(phase_2 << 0x10,uVar1,0,CH[7].SLOT[1].wavetable);
    output = iVar2 * 2 + output;
  }
  uVar1 = CH[8].SLOT[0].TLL + CH[8].SLOT[0].volume + (LFO_AM & CH[8].SLOT[0].AMmask);
  if (uVar1 < 0x180) {
    iVar2 = op_calc(CH[8].SLOT[0].Cnt,uVar1,0,CH[8].SLOT[1].wavetable);
    output = iVar2 * 2 + output;
  }
  uVar1 = CH[8].SLOT[1].TLL + CH[8].SLOT[1].volume + (LFO_AM & CH[8].SLOT[1].AMmask);
  if (uVar1 < 0x180) {
    local_40 = 0x100;
    if (((byte)(CH[7].SLOT[0].Cnt >> 0x12) & 1) != ((byte)(CH[7].SLOT[0].Cnt >> 0x17) & 1) ||
        (CH[7].SLOT[0].Cnt >> 0x13 & 1) != 0) {
      local_40 = 0x300;
    }
    if (((byte)(CH[8].SLOT[1].Cnt >> 0x13) & 1) != ((byte)(CH[8].SLOT[1].Cnt >> 0x15) & 1)) {
      local_40 = 0x300;
    }
    iVar2 = op_calc(local_40 << 0x10,uVar1,0,CH[8].SLOT[1].wavetable);
    output = iVar2 * 2 + output;
  }
  return;
}

Assistant:

INLINE void OPL_CALC_RH( OPL_CH *CH, unsigned int noise )
{
	OPL_SLOT *SLOT;
	signed int out;
	unsigned int env;


	/* Bass Drum (verified on real YM3812):
	  - depends on the channel 6 'connect' register:
	      when connect = 0 it works the same as in normal (non-rhythm) mode (op1->op2->out)
	      when connect = 1 _only_ operator 2 is present on output (op2->out), operator 1 is ignored
	  - output sample always is multiplied by 2
	*/

	phase_modulation = 0;
	/* SLOT 1 */
	SLOT = &CH[6].SLOT[SLOT1];
	env = volume_calc(SLOT);

	out = SLOT->op1_out[0] + SLOT->op1_out[1];
	SLOT->op1_out[0] = SLOT->op1_out[1];

	if (!SLOT->CON)
		phase_modulation = SLOT->op1_out[0];
	/* else ignore output of operator 1 */

	SLOT->op1_out[1] = 0;
	if( env < ENV_QUIET )
	{
		if (!SLOT->FB)
			out = 0;
		SLOT->op1_out[1] = op_calc1(SLOT->Cnt, env, (out<<SLOT->FB), SLOT->wavetable );
	}

	/* SLOT 2 */
	SLOT++;
	env = volume_calc(SLOT);
	if( env < ENV_QUIET )
		output += op_calc(SLOT->Cnt, env, phase_modulation, SLOT->wavetable) * 2;


	/* Phase generation is based on: */
	/* HH  (13) channel 7->slot 1 combined with channel 8->slot 2 (same combination as TOP CYMBAL but different output phases) */
	/* SD  (16) channel 7->slot 1 */
	/* TOM (14) channel 8->slot 1 */
	/* TOP (17) channel 7->slot 1 combined with channel 8->slot 2 (same combination as HIGH HAT but different output phases) */

	/* Envelope generation based on: */
	/* HH  channel 7->slot1 */
	/* SD  channel 7->slot2 */
	/* TOM channel 8->slot1 */
	/* TOP channel 8->slot2 */


	/* The following formulas can be well optimized.
	   I leave them in direct form for now (in case I've missed something).
	*/

	/* High Hat (verified on real YM3812) */
	env = volume_calc(&CH[7].SLOT[SLOT1]);
	if( env < ENV_QUIET )
	{

		/* high hat phase generation:
			phase = d0 or 234 (based on frequency only)
			phase = 34 or 2d0 (based on noise)
		*/

		/* base frequency derived from operator 1 in channel 7 */
		unsigned char bit7 = ((CH[7].SLOT[SLOT1].Cnt>>FREQ_SH)>>7)&1;
		unsigned char bit3 = ((CH[7].SLOT[SLOT1].Cnt>>FREQ_SH)>>3)&1;
		unsigned char bit2 = ((CH[7].SLOT[SLOT1].Cnt>>FREQ_SH)>>2)&1;

		unsigned char res1 = (bit2 ^ bit7) | bit3;

		/* when res1 = 0 phase = 0x000 | 0xd0; */
		/* when res1 = 1 phase = 0x200 | (0xd0>>2); */
		UINT32 phase = res1 ? (0x200|(0xd0>>2)) : 0xd0;

		/* enable gate based on frequency of operator 2 in channel 8 */
		unsigned char bit5e= ((CH[8].SLOT[SLOT2].Cnt>>FREQ_SH)>>5)&1;
		unsigned char bit3e= ((CH[8].SLOT[SLOT2].Cnt>>FREQ_SH)>>3)&1;

		unsigned char res2 = (bit3e ^ bit5e);

		/* when res2 = 0 pass the phase from calculation above (res1); */
		/* when res2 = 1 phase = 0x200 | (0xd0>>2); */
		if (res2)
			phase = (0x200|(0xd0>>2));


		/* when phase & 0x200 is set and noise=1 then phase = 0x200|0xd0 */
		/* when phase & 0x200 is set and noise=0 then phase = 0x200|(0xd0>>2), ie no change */
		if (phase&0x200)
		{
			if (noise)
				phase = 0x200|0xd0;
		}
		else
		/* when phase & 0x200 is clear and noise=1 then phase = 0xd0>>2 */
		/* when phase & 0x200 is clear and noise=0 then phase = 0xd0, ie no change */
		{
			if (noise)
				phase = 0xd0>>2;
		}

		output += op_calc(phase<<FREQ_SH, env, 0, CH[7].SLOT[SLOT1].wavetable) * 2;
	}

	/* Snare Drum (verified on real YM3812) */
	env = volume_calc(&CH[7].SLOT[SLOT2]);
	if( env < ENV_QUIET )
	{
		/* base frequency derived from operator 1 in channel 7 */
		unsigned char bit8 = ((CH[7].SLOT[SLOT1].Cnt>>FREQ_SH)>>8)&1;

		/* when bit8 = 0 phase = 0x100; */
		/* when bit8 = 1 phase = 0x200; */
		UINT32 phase = bit8 ? 0x200 : 0x100;

		/* Noise bit XOR'es phase by 0x100 */
		/* when noisebit = 0 pass the phase from calculation above */
		/* when noisebit = 1 phase ^= 0x100; */
		/* in other words: phase ^= (noisebit<<8); */
		if (noise)
			phase ^= 0x100;

		output += op_calc(phase<<FREQ_SH, env, 0, CH[7].SLOT[SLOT2].wavetable) * 2;
	}

	/* Tom Tom (verified on real YM3812) */
	env = volume_calc(&CH[8].SLOT[SLOT1]);
	if( env < ENV_QUIET )
		output += op_calc(CH[8].SLOT[SLOT1].Cnt, env, 0, CH[8].SLOT[SLOT2].wavetable) * 2;

	/* Top Cymbal (verified on real YM3812) */
	env = volume_calc(&CH[8].SLOT[SLOT2]);
	if( env < ENV_QUIET )
	{
		/* base frequency derived from operator 1 in channel 7 */
		unsigned char bit7 = ((CH[7].SLOT[SLOT1].Cnt>>FREQ_SH)>>7)&1;
		unsigned char bit3 = ((CH[7].SLOT[SLOT1].Cnt>>FREQ_SH)>>3)&1;
		unsigned char bit2 = ((CH[7].SLOT[SLOT1].Cnt>>FREQ_SH)>>2)&1;

		unsigned char res1 = (bit2 ^ bit7) | bit3;

		/* when res1 = 0 phase = 0x000 | 0x100; */
		/* when res1 = 1 phase = 0x200 | 0x100; */
		UINT32 phase = res1 ? 0x300 : 0x100;

		/* enable gate based on frequency of operator 2 in channel 8 */
		unsigned char bit5e= ((CH[8].SLOT[SLOT2].Cnt>>FREQ_SH)>>5)&1;
		unsigned char bit3e= ((CH[8].SLOT[SLOT2].Cnt>>FREQ_SH)>>3)&1;

		unsigned char res2 = (bit3e ^ bit5e);
		/* when res2 = 0 pass the phase from calculation above (res1); */
		/* when res2 = 1 phase = 0x200 | 0x100; */
		if (res2)
			phase = 0x300;

		output += op_calc(phase<<FREQ_SH, env, 0, CH[8].SLOT[SLOT2].wavetable) * 2;
	}

}